

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.cpp
# Opt level: O0

void __thiscall
QDeadlineTimer::setRemainingTime(QDeadlineTimer *this,qint64 msecs,TimerType timerType)

{
  longlong lVar1;
  qint64 qVar2;
  TimerType in_EDX;
  long in_RSI;
  longlong *in_RDI;
  long in_FS_OFFSET;
  QDeadlineTimer QVar3;
  milliseconds ms;
  TimerType in_stack_ffffffffffffff88;
  ForeverConstant in_stack_ffffffffffffff8c;
  QDeadlineTimer *in_stack_ffffffffffffff90;
  duration<long,_std::ratio<1L,_1000L>_> dur;
  longlong local_40;
  longlong lStack_38;
  QDeadlineTimer local_30;
  longlong local_20;
  longlong local_18;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI < 0) {
    QDeadlineTimer(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    *in_RDI = local_20;
    in_RDI[1] = local_18;
  }
  else if (in_RSI == 0) {
    QDeadlineTimer(&local_30,in_EDX);
    *in_RDI = local_30.t1;
    in_RDI[1] = local_30._8_8_;
    lVar1 = std::numeric_limits<long_long>::min();
    *in_RDI = lVar1;
  }
  else {
    QVar3 = current((TimerType)((ulong)in_RDI >> 0x20));
    local_40 = QVar3.t1;
    lStack_38 = QVar3._8_8_;
    *in_RDI = local_40;
    in_RDI[1] = lStack_38;
    dur.__r = (rep)&DAT_aaaaaaaaaaaaaaaa;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb8,&local_10);
    qVar2 = add_saturate<std::chrono::duration<long,std::ratio<1l,1000l>>>((qint64)in_RDI,dur);
    *in_RDI = qVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDeadlineTimer::setRemainingTime(qint64 msecs, Qt::TimerType timerType) noexcept
{
    if (msecs < 0) {
        *this = QDeadlineTimer(Forever, timerType);
    } else if (msecs == 0) {
        *this = QDeadlineTimer(timerType);
        t1 = std::numeric_limits<qint64>::min();
    } else {
        *this = current(timerType);
        milliseconds ms(msecs);
        t1 = add_saturate(t1, ms);
    }
}